

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioReadEqn.c
# Opt level: O0

void Io_ReadEqnStrCutAt(char *pStr,char *pStop,int fUniqueOnly,Vec_Ptr_t *vTokens)

{
  int iVar1;
  undefined8 local_30;
  char *pToken;
  Vec_Ptr_t *vTokens_local;
  int fUniqueOnly_local;
  char *pStop_local;
  char *pStr_local;
  
  Vec_PtrClear(vTokens);
  local_30 = strtok(pStr,pStop);
  do {
    if (local_30 == (char *)0x0) {
      return;
    }
    if (fUniqueOnly == 0) {
LAB_00351d10:
      Vec_PtrPush(vTokens,local_30);
    }
    else {
      iVar1 = Io_ReadEqnStrFind(vTokens,local_30);
      if (iVar1 == -1) goto LAB_00351d10;
    }
    local_30 = strtok((char *)0x0,pStop);
  } while( true );
}

Assistant:

void Io_ReadEqnStrCutAt( char * pStr, char * pStop, int fUniqueOnly, Vec_Ptr_t * vTokens )
{
    char * pToken;
    Vec_PtrClear( vTokens );
    for ( pToken = strtok( pStr, pStop ); pToken; pToken = strtok( NULL, pStop ) )
        if ( !fUniqueOnly || Io_ReadEqnStrFind( vTokens, pToken ) == -1 )
            Vec_PtrPush( vTokens, pToken );
}